

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveObjectsWriter.cpp
# Opt level: O0

void __thiscall PrimitiveObjectsWriter::WriteKeyword(PrimitiveObjectsWriter *this,string *inKeyword)

{
  IByteWriter *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string *inKeyword_local;
  PrimitiveObjectsWriter *this_local;
  
  if (this->mStreamForWriting != (IByteWriter *)0x0) {
    pIVar1 = this->mStreamForWriting;
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::size();
    (*pIVar1->_vptr_IByteWriter[2])(pIVar1,uVar2,uVar3);
    EndLine(this);
  }
  return;
}

Assistant:

void PrimitiveObjectsWriter::WriteKeyword(const std::string& inKeyword)
{
	if(!mStreamForWriting)
		return;
	mStreamForWriting->Write((const IOBasicTypes::Byte *)inKeyword.c_str(),inKeyword.size());
	EndLine();
}